

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

bool __thiscall
obx::Box<objectbox::tsdemo::NamedTimeRange>::get
          (Box<objectbox::tsdemo::NamedTimeRange> *this,obx_id id,NamedTimeRange *outObject)

{
  int err;
  size_t size;
  void *data;
  CursorTx ctx;
  
  anon_unknown_3::CursorTx::CursorTx(&ctx,READ,(this->super_BoxTypeless).store_,1);
  err = obx_cursor_get(ctx.cCursor_,id,&data,&size);
  if (err != 0x194) {
    internal::checkErrOrThrow(err);
    objectbox::tsdemo::NamedTimeRange::_OBX_MetaInfo::fromFlatBuffer(data,size,outObject);
  }
  anon_unknown_3::CursorTx::~CursorTx(&ctx);
  return err != 0x194;
}

Assistant:

bool get(obx_id id, EntityT& outObject) {
        CursorTx ctx(TxMode::READ, store_, EntityBinding::entityId());
        const void* data;
        size_t size;
        if (!get(ctx, id, &data, &size)) return false;
        EntityBinding::fromFlatBuffer(data, size, outObject);
        return true;
    }